

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprinteg.h
# Opt level: O1

void __thiscall TPZPrInteg<TPZInt1d>::TPZPrInteg(TPZPrInteg<TPZInt1d> *this,int order)

{
  TPZGaussRule *pTVar1;
  
  TPZInt1d::TPZInt1d(&this->super_TPZInt1d,order,0);
  (this->super_TPZInt1d).super_TPZIntPoints._vptr_TPZIntPoints =
       (_func_int **)&PTR__TPZPrInteg_01844060;
  if (order < 1) {
    this->fOrdKsi = 0;
    this->fIntP = (TPZGaussRule *)0x0;
  }
  else {
    pTVar1 = TPZIntRuleList::GetRule(&TPZIntRuleList::gIntRuleList,order,0);
    this->fIntP = pTVar1;
    this->fOrdKsi = order;
  }
  return;
}

Assistant:

TPZPrInteg(int order) : TFather(order)
    {
		if(order>0)
		{
			fIntP   = TPZIntRuleList::gIntRuleList.GetRule(order);
			fOrdKsi = order;
		}
		else
		{
			fOrdKsi = 0;
			fIntP = 0;
		}
    }